

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v1.cpp
# Opt level: O0

void __thiscall intel_acbp_v1_t::pmda_body_t::_read(pmda_body_t *this)

{
  uint16_t uVar1;
  uint32_t uVar2;
  vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>
  *this_00;
  pointer this_01;
  pmda_entry_v1_t *this_02;
  vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>
  *this_03;
  pointer this_04;
  pmda_entry_v2_t *this_05;
  unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>
  local_50;
  int local_48;
  uint32_t local_44;
  int i_1;
  int l_entries_v2;
  unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>
  local_28;
  int local_20;
  uint32_t local_1c;
  int i;
  int l_entries_v1;
  pmda_body_t *local_10;
  pmda_body_t *this_local;
  
  local_10 = this;
  uVar1 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_total_size = uVar1;
  uVar2 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_version = uVar2;
  uVar2 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_num_entries = uVar2;
  this->n_entries_v1 = true;
  uVar2 = version(this);
  if (uVar2 == 1) {
    this->n_entries_v1 = false;
    this_00 = (vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>
               *)operator_new(0x18);
    memset(this_00,0,0x18);
    std::
    vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>
    ::vector(this_00);
    std::
    unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>>>>>
    ::
    unique_ptr<std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>>>>,void>
              ((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>>>>>
                *)&i,this_00);
    std::
    unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>_>_>
    ::operator=(&this->m_entries_v1,
                (unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>_>_>
                 *)&i);
    std::
    unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>_>_>
                   *)&i);
    local_1c = num_entries(this);
    for (local_20 = 0; local_20 < (int)local_1c; local_20 = local_20 + 1) {
      this_01 = std::
                unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>_>_>
                ::operator->(&this->m_entries_v1);
      this_02 = (pmda_entry_v1_t *)operator_new(0x48);
      pmda_entry_v1_t::pmda_entry_v1_t(this_02,(this->super_kstruct).m__io,this,this->m__root);
      std::
      unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>
      ::unique_ptr<std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>,void>
                ((unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>
                  *)&local_28,this_02);
      std::
      vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>
      ::push_back(this_01,(value_type *)&local_28);
      std::
      unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>
      ::~unique_ptr(&local_28);
    }
  }
  this->n_entries_v2 = true;
  uVar2 = version(this);
  if (uVar2 == 2) {
    this->n_entries_v2 = false;
    this_03 = (vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>
               *)operator_new(0x18);
    memset(this_03,0,0x18);
    std::
    vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>
    ::vector(this_03);
    std::
    unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>>>>>
    ::
    unique_ptr<std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>>>>,void>
              ((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>>>>>
                *)&i_1,this_03);
    std::
    unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>_>_>
    ::operator=(&this->m_entries_v2,
                (unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>_>_>
                 *)&i_1);
    std::
    unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>_>_>
                   *)&i_1);
    local_44 = num_entries(this);
    for (local_48 = 0; local_48 < (int)local_44; local_48 = local_48 + 1) {
      this_04 = std::
                unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>_>_>
                ::operator->(&this->m_entries_v2);
      this_05 = (pmda_entry_v2_t *)operator_new(0x30);
      pmda_entry_v2_t::pmda_entry_v2_t(this_05,(this->super_kstruct).m__io,this,this->m__root);
      std::
      unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>
      ::unique_ptr<std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>,void>
                ((unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>
                  *)&local_50,this_05);
      std::
      vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>
      ::push_back(this_04,(value_type *)&local_50);
      std::
      unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>
      ::~unique_ptr(&local_50);
    }
  }
  return;
}

Assistant:

void intel_acbp_v1_t::pmda_body_t::_read() {
    m_total_size = m__io->read_u2le();
    m_version = m__io->read_u4le();
    m_num_entries = m__io->read_u4le();
    n_entries_v1 = true;
    if (version() == 1) {
        n_entries_v1 = false;
        m_entries_v1 = std::unique_ptr<std::vector<std::unique_ptr<pmda_entry_v1_t>>>(new std::vector<std::unique_ptr<pmda_entry_v1_t>>());
        const int l_entries_v1 = num_entries();
        for (int i = 0; i < l_entries_v1; i++) {
            m_entries_v1->push_back(std::move(std::unique_ptr<pmda_entry_v1_t>(new pmda_entry_v1_t(m__io, this, m__root))));
        }
    }
    n_entries_v2 = true;
    if (version() == 2) {
        n_entries_v2 = false;
        m_entries_v2 = std::unique_ptr<std::vector<std::unique_ptr<pmda_entry_v2_t>>>(new std::vector<std::unique_ptr<pmda_entry_v2_t>>());
        const int l_entries_v2 = num_entries();
        for (int i = 0; i < l_entries_v2; i++) {
            m_entries_v2->push_back(std::move(std::unique_ptr<pmda_entry_v2_t>(new pmda_entry_v2_t(m__io, this, m__root))));
        }
    }
}